

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_rotatePoint(double *x,double *y)

{
  TAngle<double> local_38;
  TAngle<double> local_30;
  double local_28;
  double pivoty;
  double pivotx;
  double *y_local;
  double *x_local;
  
  pivoty = m_x + m_w / 2.0;
  local_28 = m_y + m_h / 2.0;
  *x = *x - pivoty;
  *y = *y - local_28;
  pivotx = (double)y;
  y_local = x;
  TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
  TAngle<double>::operator-(&local_38);
  TAngle<double>::operator+(&local_30,90.0);
  AM_rotate(x,y,&local_30);
  *y_local = pivoty + *y_local;
  *(double *)pivotx = local_28 + *(double *)pivotx;
  return;
}

Assistant:

void AM_rotatePoint (double *x, double *y)
{
	double pivotx = m_x + m_w/2;
	double pivoty = m_y + m_h/2;
	*x -= pivotx;
	*y -= pivoty;
	AM_rotate (x, y, -players[consoleplayer].camera->Angles.Yaw + 90.);
	*x += pivotx;
	*y += pivoty;
}